

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PDFPageInput.cpp
# Opt level: O2

PDFRectangle * __thiscall
PDFPageInput::GetCropBox(PDFRectangle *__return_storage_ptr__,PDFPageInput *this)

{
  PDFDictionary *inDictionary;
  EStatusCode EVar1;
  PDFObject *inOriginal;
  PDFArray *inPDFArray;
  PDFPageInput *this_00;
  PDFObjectCastPtr<PDFArray> cropBox;
  allocator<char> local_49;
  RefCountPtr<PDFArray> local_48;
  undefined1 local_38 [32];
  
  PDFRectangle::PDFRectangle(__return_storage_ptr__);
  inDictionary = (this->mPageObject).super_RefCountPtr<PDFDictionary>.mValue;
  std::__cxx11::string::string<std::allocator<char>>((string *)local_38,"CropBox",&local_49);
  inOriginal = QueryInheritedValue(this,inDictionary,(string *)local_38);
  inPDFArray = PDFObjectCast<PDFArray>(inOriginal);
  local_48._vptr_RefCountPtr = (_func_int **)&PTR__RefCountPtr_0036d8f8;
  this_00 = (PDFPageInput *)local_38;
  local_48.mValue = inPDFArray;
  std::__cxx11::string::~string((string *)this_00);
  EVar1 = SetPDFRectangleFromPDFArray(this_00,inPDFArray,__return_storage_ptr__);
  if (EVar1 != eSuccess) {
    GetMediaBox((PDFRectangle *)local_38,this);
    __return_storage_ptr__->UpperRightX = (double)local_38._16_8_;
    __return_storage_ptr__->UpperRightY = (double)local_38._24_8_;
    __return_storage_ptr__->LowerLeftX = (double)local_38._0_8_;
    __return_storage_ptr__->LowerLeftY = (double)local_38._8_8_;
    PDFRectangle::~PDFRectangle((PDFRectangle *)local_38);
  }
  RefCountPtr<PDFArray>::~RefCountPtr(&local_48);
  return __return_storage_ptr__;
}

Assistant:

PDFRectangle PDFPageInput::GetCropBox()
{
    PDFRectangle result;
    PDFObjectCastPtr<PDFArray> cropBox(QueryInheritedValue(mPageObject.GetPtr(),"CropBox"));
    
    if(SetPDFRectangleFromPDFArray(cropBox.GetPtr(),result) != eSuccess)
        result = GetMediaBox();
    return result;
}